

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall
asmjit::CodeHolder::newNamedLabelId
          (CodeHolder *this,uint32_t *idOut,char *name,size_t nameLength,uint32_t type,
          uint32_t parentId)

{
  ZoneHeap *heap;
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t uVar4;
  int iVar5;
  Error EVar6;
  int iVar7;
  ZoneHashNode *pZVar8;
  undefined4 extraout_var;
  uint32_t uVar9;
  ZoneHashNode *__s1;
  ulong local_40;
  size_t local_38;
  
  *idOut = 0;
  local_40 = nameLength;
  uVar4 = anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_40);
  uVar3 = local_40;
  if (local_40 == 0) {
    return 0x11;
  }
  if (0x800 < local_40) {
    return 0x10;
  }
  if (type == 2) {
    if (parentId != 0) {
      return 0x13;
    }
LAB_00114bfe:
    for (pZVar8 = *(this->_namedLabels).super_ZoneHashBase._data; iVar5 = (int)uVar3,
        pZVar8 != (ZoneHashNode *)0x0; pZVar8 = *(ZoneHashNode **)pZVar8) {
      if (*(int *)(pZVar8 + 0x30) == iVar5) {
        if (uVar3 < 0xc) {
          __s1 = pZVar8 + 0x34;
        }
        else {
          __s1 = *(ZoneHashNode **)(pZVar8 + 0x38);
        }
        iVar5 = bcmp(__s1,name,uVar3);
        if (iVar5 == 0) {
          return 0xf;
        }
      }
    }
    uVar2 = (this->_labels).super_ZoneVectorBase._length;
    if (0xfffffe < uVar2 >> 8) {
      return 0xd;
    }
    heap = &this->_baseHeap;
    if (((this->_labels).super_ZoneVectorBase._capacity == uVar2) &&
       (EVar6 = ZoneVectorBase::_grow(&(this->_labels).super_ZoneVectorBase,heap,8,1), EVar6 != 0))
    {
      return EVar6;
    }
    if (heap->_zone == (Zone *)0x0) {
      newNamedLabelId();
    }
    else {
      pZVar8 = (ZoneHashNode *)ZoneHeap::_allocZeroed(heap,0x40,&local_38);
      if (pZVar8 != (ZoneHashNode *)0x0) {
        uVar9 = (int)uVar2 + 0x100;
        *(uint32_t *)(pZVar8 + 8) = uVar4;
        *(uint32_t *)(pZVar8 + 0xc) = uVar9;
        pZVar8[0x10] = SUB41(type,0);
        *(undefined8 *)(pZVar8 + 0x14) = 0xffffffff00000000;
        *(undefined8 *)(pZVar8 + 0x20) = 0;
        if (uVar3 < 0xc) {
          *(int *)(pZVar8 + 0x30) = iVar5;
          memcpy(pZVar8 + 0x34,name,uVar3);
          pZVar8[uVar3 + 0x34] = (ZoneHashNode)0x0;
        }
        else {
          iVar7 = Zone::dup(&this->_dataZone,(int)name);
          if (CONCAT44(extraout_var,iVar7) == 0) {
            return 1;
          }
          *(int *)(pZVar8 + 0x30) = iVar5;
          *(long *)(pZVar8 + 0x38) = CONCAT44(extraout_var,iVar7);
        }
        uVar3 = (this->_labels).super_ZoneVectorBase._length;
        if (uVar3 < (this->_labels).super_ZoneVectorBase._capacity) {
          *(ZoneHashNode **)((long)(this->_labels).super_ZoneVectorBase._data + uVar3 * 8) = pZVar8;
          psVar1 = &(this->_labels).super_ZoneVectorBase._length;
          *psVar1 = *psVar1 + 1;
          ZoneHashBase::_put(&(this->_namedLabels).super_ZoneHashBase,pZVar8);
          *idOut = uVar9;
          return 0;
        }
        newNamedLabelId();
        goto LAB_00114db1;
      }
    }
    EVar6 = 1;
  }
  else {
    if (type != 1) {
      return 3;
    }
    if ((ulong)(parentId - 0x100) < (this->_labels).super_ZoneVectorBase._length) {
      uVar4 = uVar4 ^ parentId;
      goto LAB_00114bfe;
    }
LAB_00114db1:
    EVar6 = 0x12;
  }
  return EVar6;
}

Assistant:

Error CodeHolder::newNamedLabelId(uint32_t& idOut, const char* name, size_t nameLength, uint32_t type, uint32_t parentId) noexcept {
  idOut = 0;
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);

  if (ASMJIT_UNLIKELY(nameLength == 0))
    return DebugUtils::errored(kErrorInvalidLabelName);

  if (ASMJIT_UNLIKELY(nameLength > Globals::kMaxLabelLength))
    return DebugUtils::errored(kErrorLabelNameTooLong);

  switch (type) {
    case Label::kTypeLocal:
      if (ASMJIT_UNLIKELY(Operand::unpackId(parentId) >= _labels.getLength()))
        return DebugUtils::errored(kErrorInvalidParentLabel);

      hVal ^= parentId;
      break;

    case Label::kTypeGlobal:
      if (ASMJIT_UNLIKELY(parentId != 0))
        return DebugUtils::errored(kErrorNonLocalLabelCantHaveParent);

      break;

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  // Don't allow to insert duplicates. Local labels allow duplicates that have
  // different id, this is already accomplished by having a different hashes
  // between the same label names having different parent labels.
  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  if (ASMJIT_UNLIKELY(le))
    return DebugUtils::errored(kErrorLabelAlreadyDefined);

  Error err = kErrorOk;
  size_t index = _labels.getLength();

  if (ASMJIT_UNLIKELY(index >= Operand::kPackedIdCount))
    return DebugUtils::errored(kErrorLabelIndexOverflow);

  ASMJIT_PROPAGATE(_labels.willGrow(&_baseHeap));
  le = _baseHeap.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return  DebugUtils::errored(kErrorNoHeapMemory);

  uint32_t id = Operand::packId(static_cast<uint32_t>(index));
  le->_hVal = hVal;
  le->_setId(id);
  le->_type = static_cast<uint8_t>(type);
  le->_parentId = 0;
  le->_sectionId = SectionEntry::kInvalidId;
  le->_offset = 0;

  if (le->_name.mustEmbed(nameLength)) {
    le->_name.setEmbedded(name, nameLength);
  }
  else {
    char* nameExternal = static_cast<char*>(_dataZone.dup(name, nameLength, true));
    if (ASMJIT_UNLIKELY(!nameExternal))
      return DebugUtils::errored(kErrorNoHeapMemory);
    le->_name.setExternal(nameExternal, nameLength);
  }

  _labels.appendUnsafe(le);
  _namedLabels.put(le);

  idOut = id;
  return err;
}